

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * append_str(char *zText,int n,int p1,int p2)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char zInt [40];
  char local_58 [40];
  
  pcVar5 = append_str::z;
  if (zText == (char *)0x0) {
    if (append_str::z != (char *)0x0 && append_str::used == 0) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
  }
  else {
    sVar3 = (size_t)(uint)n;
    if (n < 1) {
      if (n < 0) {
        append_str::used = append_str::used + n;
      }
      sVar3 = strlen(zText);
    }
    uVar7 = (uint)sVar3;
    if (append_str::alloced <= (int)(append_str::used + uVar7 + 0x50)) {
      append_str::alloced = append_str::used + uVar7 + 0x118;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    pcVar5 = append_str::z;
    if (append_str::z == (char *)0x0) {
      pcVar5 = append_str::empty;
    }
    else {
      while (append_str::z = pcVar5, 0 < (int)uVar7) {
        pcVar8 = zText + 1;
        iVar6 = (int)sVar3;
        if ((iVar6 == 1 || *zText != '%') || (*pcVar8 != 'd')) {
          uVar7 = iVar6 - 1;
          lVar4 = (long)append_str::used;
          append_str::used = append_str::used + 1;
          pcVar5[lVar4] = *zText;
        }
        else {
          lemon_sprintf(local_58,"%d",(ulong)(uint)p1);
          iVar2 = append_str::used;
          pcVar5 = append_str::z + append_str::used;
          lVar4 = 0;
          do {
            cVar1 = local_58[lVar4];
            pcVar5[lVar4] = cVar1;
            lVar4 = lVar4 + 1;
          } while (cVar1 != '\0');
          sVar3 = strlen(pcVar5);
          append_str::used = (int)sVar3 + iVar2;
          pcVar8 = zText + 2;
          uVar7 = iVar6 - 2;
          p1 = p2;
        }
        sVar3 = (size_t)uVar7;
        zText = pcVar8;
        pcVar5 = append_str::z;
      }
      pcVar5[append_str::used] = '\0';
    }
  }
  return pcVar5;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( (int) (n+sizeof(zInt)*2+used) >= alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( c=='%' && n>0 && zText[0]=='d' ){
      lemon_sprintf(zInt, "%d", p1);
      p1 = p2;
      lemon_strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = (char)c;
    }
  }
  z[used] = 0;
  return z;
}